

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O1

void __thiscall
packing::AssignedProtos::
addUniqueColors<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
          (AssignedProtos *this,
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          *colors,Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                  iter,
          Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
          *end,vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPals)

{
  long *plVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  pointer *ppoVar4;
  __hashtable *__h;
  pointer *ppoVar5;
  AssignedProtos *local_38;
  
  ppoVar4 = (pointer *)iter._array;
  if (*(remove_const_t<decltype(_assigned)> **)
       &((iter._iter._M_current._M_current)->
        super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
        super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
        super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
        super__Bvector_base<std::allocator<bool>_>._M_impl !=
      (remove_const_t<decltype(_assigned)> *)ppoVar4) {
    do {
      if ((char)ppoVar4[6] == '\0') {
        __assert_fail("(*_iter).has_value()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_packing.cpp"
                      ,0x72,
                      "reference packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs> *, std::vector<std::optional<packing::ProtoPalAttrs>>>, std::remove_const_t>::operator*() const [Inner = __gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs> *, std::vector<std::optional<packing::ProtoPalAttrs>>>, Constness = std::remove_const_t]"
                     );
      }
      ppoVar5 = &(end->_array->
                 super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)*ppoVar4;
      pvVar2 = ProtoPalette::begin((ProtoPalette *)ppoVar5);
      pvVar3 = ProtoPalette::end((ProtoPalette *)ppoVar5);
      local_38 = this;
      for (; pvVar2 != pvVar3; pvVar2 = pvVar2 + 1) {
        std::
        _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_short_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                  ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this,pvVar2,&local_38);
      }
      ppoVar5 = ppoVar4;
      do {
        ppoVar4 = ppoVar5 + 7;
        if (ppoVar4 == (pointer *)(colors->_M_h)._M_bucket_count) break;
        plVar1 = (long *)(ppoVar5 + 0xd);
        ppoVar5 = ppoVar4;
      } while ((char)*plVar1 == '\0');
    } while (ppoVar4 !=
             (pointer *)
             *(long **)&((iter._iter._M_current._M_current)->
                        super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                        super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                        super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                        bannedPages.super__Bvector_base<std::allocator<bool>_>._M_impl);
  }
  return;
}

Assistant:

static void addUniqueColors(std::unordered_set<uint16_t> &colors, Iter iter, Iter const &end,
	                            std::vector<ProtoPalette> const &protoPals) {
		for (; iter != end; ++iter) {
			ProtoPalette const &protoPal = protoPals[iter->protoPalIndex];
			colors.insert(protoPal.begin(), protoPal.end());
		}
	}